

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IndexedByLookup(Parse *pParse,SrcItem *pFrom)

{
  char *zRight;
  Index *pIVar1;
  int iVar2;
  Index **ppIVar3;
  
  zRight = (pFrom->u1).zIndexedBy;
  ppIVar3 = &pFrom->pTab->pIndex;
  while( true ) {
    pIVar1 = *ppIVar3;
    if (pIVar1 == (Index *)0x0) {
      sqlite3ErrorMsg(pParse,"no such index: %s",zRight,0);
      pParse->checkSchema = '\x01';
      return 1;
    }
    iVar2 = sqlite3StrICmp(pIVar1->zName,zRight);
    if (iVar2 == 0) break;
    ppIVar3 = &pIVar1->pNext;
  }
  (pFrom->u2).pIBIndex = pIVar1;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexedByLookup(Parse *pParse, SrcItem *pFrom){
  Table *pTab = pFrom->pTab;
  char *zIndexedBy = pFrom->u1.zIndexedBy;
  Index *pIdx;
  assert( pTab!=0 );
  assert( pFrom->fg.isIndexedBy!=0 );

  for(pIdx=pTab->pIndex;
      pIdx && sqlite3StrICmp(pIdx->zName, zIndexedBy);
      pIdx=pIdx->pNext
  );
  if( !pIdx ){
    sqlite3ErrorMsg(pParse, "no such index: %s", zIndexedBy, 0);
    pParse->checkSchema = 1;
    return SQLITE_ERROR;
  }
  assert( pFrom->fg.isCte==0 );
  pFrom->u2.pIBIndex = pIdx;
  return SQLITE_OK;
}